

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

Matcher<const_std::vector<void_*,_std::allocator<void_*>_>_&> * __thiscall
testing::internal::UnorderedElementsAreArrayMatcher::operator_cast_to_Matcher
          (Matcher<const_std::vector<void_*,_std::allocator<void_*>_>_&> *__return_storage_ptr__,
          UnorderedElementsAreArrayMatcher *this)

{
  UnorderedElementsAreMatcherImpl<std::vector<void*,std::allocator<void*>>const&> *this_00;
  undefined4 *puVar1;
  
  this_00 = (UnorderedElementsAreMatcherImpl<std::vector<void*,std::allocator<void*>>const&> *)
            operator_new(0x40);
  UnorderedElementsAreMatcherImpl<std::vector<void*,std::allocator<void*>>const&>::
  UnorderedElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>>>
            (this_00,*(Flags *)this,
             (__normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>)
             *(void ***)(this + 8),
             (__normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>)
             *(void ***)(this + 0x10));
  (__return_storage_ptr__->super_MatcherBase<const_std::vector<void_*,_std::allocator<void_*>_>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_018d1e68;
  (__return_storage_ptr__->super_MatcherBase<const_std::vector<void_*,_std::allocator<void_*>_>_&>).
  vtable_ = (VTable *)0x0;
  (__return_storage_ptr__->super_MatcherBase<const_std::vector<void_*,_std::allocator<void_*>_>_&>).
  buffer_.ptr = (void *)0x0;
  (__return_storage_ptr__->super_MatcherBase<const_std::vector<void_*,_std::allocator<void_*>_>_&>).
  vtable_ = (VTable *)
            MatcherBase<std::vector<void*,std::allocator<void*>>const&>::
            GetVTable<testing::internal::MatcherBase<std::vector<void*,std::allocator<void*>>const&>::ValuePolicy<testing::MatcherInterface<std::vector<void*,std::allocator<void*>>const&>const*,true>>()
            ::kVTable;
  puVar1 = (undefined4 *)operator_new(0x10);
  *puVar1 = 1;
  *(UnorderedElementsAreMatcherImpl<std::vector<void*,std::allocator<void*>>const&> **)(puVar1 + 2)
       = this_00;
  (__return_storage_ptr__->super_MatcherBase<const_std::vector<void_*,_std::allocator<void_*>_>_&>).
  buffer_.ptr = puVar1;
  (__return_storage_ptr__->super_MatcherBase<const_std::vector<void_*,_std::allocator<void_*>_>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_018d1df8;
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    return Matcher<Container>(
        new UnorderedElementsAreMatcherImpl<const Container&>(
            match_flags_, matchers_.begin(), matchers_.end()));
  }